

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_ManMergeCuts(Sbd_Man_t *p,int Node)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  int *piVar9;
  int *piVar10;
  uint uVar11;
  Sbd_Man_t *p_00;
  int iVar12;
  int iVar13;
  int iVar14;
  int *local_160;
  int *local_158;
  int Cut0 [2];
  int Cut1 [2];
  int pCut00 [13];
  int pCut10 [13];
  int pCut01 [13];
  int pCut11 [13];
  
  pGVar8 = Gia_ManObj(p->pGia,Node);
  uVar1 = *(uint *)pGVar8;
  iVar13 = Node - (uVar1 & 0x1fffffff);
  pGVar8 = Gia_ManObj(p->pGia,Node);
  uVar11 = *(uint *)&pGVar8->field_0x4 & 0x1fffffff;
  iVar14 = Node - uVar11;
  iVar2 = Vec_IntEntry(p->vLutLevs,iVar13);
  iVar4 = 1;
  iVar3 = iVar4;
  if (iVar2 != 0) {
    iVar3 = Vec_IntEntry(p->vLutLevs,iVar13);
  }
  iVar2 = Vec_IntEntry(p->vLutLevs,iVar14);
  if (iVar2 != 0) {
    iVar4 = Vec_IntEntry(p->vLutLevs,iVar14);
  }
  piVar9 = Sbd_ObjCut(p,iVar13);
  p_00 = p;
  piVar10 = Sbd_ObjCut(p,iVar14);
  Cut0[0] = 1;
  local_158 = pCut11;
  Cut0[1] = iVar13;
  Cut1[0] = Cut0[0];
  Cut1[1] = iVar14;
  iVar14 = Sbd_CutMergeSimple(p_00,piVar9,piVar10,local_158);
  iVar5 = Sbd_CutMergeSimple(p_00,Cut0,piVar10,pCut01);
  local_160 = pCut10;
  iVar6 = Sbd_CutMergeSimple(p_00,piVar9,Cut1,local_160);
  iVar7 = Sbd_CutMergeSimple(p_00,Cut0,Cut1,pCut00);
  iVar2 = p->pPars->nLutSize;
  iVar13 = iVar4;
  if (iVar4 < iVar3) {
    iVar13 = iVar3;
  }
  if (iVar2 < iVar14) {
    iVar13 = 1000000000;
  }
  iVar12 = iVar3 + 1;
  iVar14 = iVar4;
  if (iVar4 < iVar12) {
    iVar14 = iVar12;
  }
  if (iVar2 < iVar5) {
    iVar14 = 1000000000;
  }
  iVar4 = iVar4 + 1;
  if (iVar3 <= iVar4) {
    iVar3 = iVar4;
  }
  if (iVar2 < iVar6) {
    iVar3 = 1000000000;
  }
  if (iVar4 < iVar12) {
    iVar4 = iVar12;
  }
  if (iVar2 < iVar7) {
    iVar4 = 1000000000;
  }
  if ((iVar14 < iVar13) || ((iVar14 == iVar13 && (pCut01[0] < pCut11[0])))) {
    iVar13 = iVar14;
    local_158 = pCut01;
  }
  if (iVar13 <= iVar3) {
    if (iVar3 == iVar13) {
      if (*local_158 <= pCut10[0]) {
        local_160 = local_158;
      }
    }
    else {
      local_160 = local_158;
      iVar3 = iVar13;
    }
  }
  piVar9 = pCut00;
  iVar2 = iVar4;
  if (((iVar3 <= iVar4) && (piVar9 = local_160, iVar2 = iVar3, iVar4 == iVar3)) &&
     (piVar9 = pCut00, iVar2 = iVar4, *local_160 <= pCut00[0])) {
    piVar9 = local_160;
  }
  if (uVar11 == (uVar1 & 0x1fffffff)) {
    __assert_fail("iFan0 != iFan1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                  ,0x6ad,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
  }
  iVar4 = Vec_IntEntry(p->vLutLevs,Node);
  if (iVar4 != 0) {
    __assert_fail("Vec_IntEntry(p->vLutLevs, Node) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                  ,0x6ae,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
  }
  Vec_IntWriteEntry(p->vLutLevs,Node,iVar2);
  if (p->pPars->nLutSize < *piVar9) {
    __assert_fail("pCutRes[0] <= p->pPars->nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                  ,0x6b1,"int Sbd_ManMergeCuts(Sbd_Man_t *, int)");
  }
  piVar10 = Sbd_ObjCut(p,Node);
  memcpy(piVar10,piVar9,(long)*piVar9 * 4 + 4);
  return (int)(iVar2 == 1);
}

Assistant:

int Sbd_ManMergeCuts( Sbd_Man_t * p, int Node )
{
    int pCut11[2*SBD_MAX_LUTSIZE+1];     
    int pCut01[2*SBD_MAX_LUTSIZE+1];     
    int pCut10[2*SBD_MAX_LUTSIZE+1];     
    int pCut00[2*SBD_MAX_LUTSIZE+1];     
    int iFan0   = Gia_ObjFaninId0( Gia_ManObj(p->pGia, Node), Node );
    int iFan1   = Gia_ObjFaninId1( Gia_ManObj(p->pGia, Node), Node );
    int Level0  = Vec_IntEntry( p->vLutLevs, iFan0 ) ? Vec_IntEntry( p->vLutLevs, iFan0 ) : 1;
    int Level1  = Vec_IntEntry( p->vLutLevs, iFan1 ) ? Vec_IntEntry( p->vLutLevs, iFan1 ) : 1;
    int * pCut0 = Sbd_ObjCut( p, iFan0 );
    int * pCut1 = Sbd_ObjCut( p, iFan1 );
    int Cut0[2] = {1, iFan0}; 
    int Cut1[2] = {1, iFan1}; 
    int nSize11 = Sbd_CutMergeSimple( p, pCut0, pCut1, pCut11 );
    int nSize01 = Sbd_CutMergeSimple( p,  Cut0, pCut1, pCut01 );
    int nSize10 = Sbd_CutMergeSimple( p, pCut0,  Cut1, pCut10 );
    int nSize00 = Sbd_CutMergeSimple( p,  Cut0,  Cut1, pCut00 );
    int Lev11   = nSize11 <= p->pPars->nLutSize ? Abc_MaxInt(Level0,   Level1)   : ABC_INFINITY;
    int Lev01   = nSize01 <= p->pPars->nLutSize ? Abc_MaxInt(Level0+1, Level1)   : ABC_INFINITY;
    int Lev10   = nSize10 <= p->pPars->nLutSize ? Abc_MaxInt(Level0,   Level1+1) : ABC_INFINITY;
    int Lev00   = nSize00 <= p->pPars->nLutSize ? Abc_MaxInt(Level0+1, Level1+1) : ABC_INFINITY;
    int * pCutRes = pCut11;
    int LevCur    = Lev11;
    if ( Lev01 < LevCur || (Lev01 == LevCur && pCut01[0] < pCutRes[0]) )
    {
        pCutRes = pCut01;
        LevCur  = Lev01;
    }
    if ( Lev10 < LevCur || (Lev10 == LevCur && pCut10[0] < pCutRes[0]) )
    {
        pCutRes = pCut10;
        LevCur  = Lev10;
    }
    if ( Lev00 < LevCur || (Lev00 == LevCur && pCut00[0] < pCutRes[0]) )
    {
        pCutRes = pCut00;
        LevCur  = Lev00;
    }
    assert( iFan0 != iFan1 );
    assert( Vec_IntEntry(p->vLutLevs, Node) == 0 );
    Vec_IntWriteEntry( p->vLutLevs, Node, LevCur );
    //Vec_IntWriteEntry( p->vLevs, Node, 1+Abc_MaxInt(Vec_IntEntry(p->vLevs, iFan0), Vec_IntEntry(p->vLevs, iFan1)) );
    assert( pCutRes[0] <= p->pPars->nLutSize );
    memcpy( Sbd_ObjCut(p, Node), pCutRes, sizeof(int) * (pCutRes[0] + 1) );
//printf( "Setting node %d with delay %d.\n", Node, LevCur );
    return LevCur == 1; // LevCur == Abc_MaxInt(Level0, Level1);
}